

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc.cc
# Opt level: O1

int absl::lts_20250127::crc_internal::CRCImpl::FillZeroesTable(uint32_t poly,Uint32By256 *t)

{
  bool bVar1;
  int i;
  int iVar2;
  long lVar3;
  long lVar4;
  CRCImpl *__s;
  uint uVar5;
  uint uVar6;
  uint64_t inc_len;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t l;
  uint uVar11;
  
  iVar2 = 0;
  uVar6 = 0x40000000;
  do {
    uVar5 = 0;
    uVar9 = 0x80000000;
    uVar8 = uVar6;
    do {
      uVar10 = uVar9 & uVar6;
      if ((uVar9 & uVar6) != 0) {
        uVar10 = uVar8;
      }
      uVar5 = uVar5 ^ uVar10;
      uVar8 = uVar8 >> 1 ^ -(uVar8 & 1) & poly;
      bVar1 = 1 < uVar9;
      uVar9 = uVar9 >> 1;
    } while (bVar1);
    iVar2 = iVar2 + 1;
    uVar6 = uVar5;
  } while (iVar2 != 3);
  lVar7 = 1;
  lVar3 = 0;
  do {
    iVar2 = 1;
    lVar3 = (long)(int)lVar3;
    uVar6 = uVar5;
    do {
      lVar4 = lVar3;
      (*t)[lVar4] = uVar6;
      uVar10 = 0;
      uVar9 = 0x80000000;
      uVar8 = uVar5;
      do {
        uVar11 = uVar9 & uVar6;
        if ((uVar9 & uVar6) != 0) {
          uVar11 = uVar8;
        }
        uVar10 = uVar10 ^ uVar11;
        uVar8 = uVar8 >> 1 ^ -(uVar8 & 1) & poly;
        bVar1 = 1 < uVar9;
        uVar9 = uVar9 >> 1;
      } while (bVar1);
      lVar3 = lVar4 + 1;
      iVar2 = iVar2 + 1;
      uVar6 = uVar10;
    } while (iVar2 != 0x10);
    lVar7 = lVar7 << 4;
    uVar5 = uVar10;
  } while (lVar7 != 0);
  if (lVar4 < 0x100) {
    return (int)lVar3;
  }
  FillZeroesTable();
  __s = TryNewCRC32AcceleratedX86ARMCombined();
  if (__s == (CRCImpl *)0x0) {
    __s = (CRCImpl *)operator_new(0x2008);
    memset(__s,0,0x2008);
    (__s->super_CRC)._vptr_CRC = (_func_int **)&PTR__CRC_00589cf0;
  }
  (*(__s->super_CRC)._vptr_CRC[7])(__s);
  return (int)__s;
}

Assistant:

int CRCImpl::FillZeroesTable(uint32_t poly, Uint32By256* t) {
  uint32_t inc = 1;
  inc <<= 31;

  // Extend by one zero bit. We know degree > 1 so (inc & 1) == 0.
  inc >>= 1;

  // Now extend by 2, 4, and 8 bits, so now `inc` is extended by one zero byte.
  for (int i = 0; i < 3; ++i) {
    PolyMultiply(&inc, inc, poly);
  }

  int j = 0;
  for (uint64_t inc_len = 1; inc_len != 0; inc_len <<= ZEROES_BASE_LG) {
    // Every entry in the table adds an additional inc_len zeroes.
    uint32_t v = inc;
    for (int a = 1; a != ZEROES_BASE; a++) {
      t[0][j] = v;
      PolyMultiply(&v, inc, poly);
      j++;
    }
    inc = v;
  }
  ABSL_RAW_CHECK(j <= 256, "");
  return j;
}